

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_TestSubtypeErrors_Test::TestBody(TypeTest_TestSubtypeErrors_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  Entry EVar3;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  optional<wasm::HeapType> other_02;
  string local_558;
  AssertHelper local_538;
  Message local_530;
  BuildResult local_528;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_4e0 [12];
  Entry local_4d0;
  Entry local_4c0;
  allocator<wasm::Field> local_4a9;
  uintptr_t local_4a8;
  uintptr_t local_4a0;
  Field local_498;
  Field local_488;
  iterator local_478;
  size_type local_470;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_468;
  Struct local_450;
  Entry local_438;
  allocator<wasm::Field> local_421;
  uintptr_t local_420;
  uintptr_t local_418;
  Field local_410;
  Field local_400;
  iterator local_3f0;
  size_type local_3e8;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_3e0;
  Struct local_3c8;
  TypeBuilder local_3b0;
  TypeBuilder builder_3;
  AssertHelper local_388;
  Message local_380;
  BuildResult local_378;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_330 [12];
  Entry local_320;
  Entry local_310;
  uintptr_t local_300;
  Field local_2f8;
  Array local_2e8;
  Entry local_2d8;
  uintptr_t local_2c8;
  Field local_2c0;
  Array local_2b0;
  TypeBuilder local_2a0;
  TypeBuilder builder_2;
  AssertHelper local_278;
  Message local_270;
  BuildResult local_268;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_220 [12];
  Entry local_210;
  Entry local_200;
  uintptr_t local_1f0;
  uintptr_t local_1e8;
  uintptr_t local_1e0;
  uintptr_t *local_1d8;
  undefined8 local_1d0;
  Type local_1c8;
  Type local_1c0;
  Signature local_1b8;
  Entry local_1a8;
  uintptr_t local_198;
  uintptr_t local_190;
  uintptr_t *local_188;
  undefined8 local_180;
  Type local_178;
  Type local_170;
  Signature local_168;
  TypeBuilder local_158;
  TypeBuilder builder_1;
  AssertHelper local_130;
  Message local_128;
  BuildResult local_120;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_d8 [12];
  Entry local_c8;
  Entry local_b8;
  Type local_a8;
  Type local_a0;
  Signature local_98;
  Entry local_88;
  uintptr_t local_78;
  Type local_60;
  Signature local_58;
  TypeBuilder local_48;
  TypeBuilder builder;
  Type local_38;
  Type funcref;
  Type local_28;
  Type eqref;
  Type local_18;
  Type anyref;
  TypeTest_TestSubtypeErrors_Test *this_local;
  
  anyref.id = (uintptr_t)this;
  ::wasm::HeapType::HeapType((HeapType *)&eqref,any);
  ::wasm::Type::Type(&local_18,(HeapType)eqref.id,Nullable,Inexact);
  ::wasm::HeapType::HeapType((HeapType *)&funcref,eq);
  ::wasm::Type::Type(&local_28,(HeapType)funcref.id,Nullable,Inexact);
  ::wasm::HeapType::HeapType((HeapType *)&builder,func);
  ::wasm::Type::Type(&local_38,
                     (HeapType)
                     builder.impl._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,Nullable,
                     Inexact);
  ::wasm::TypeBuilder::TypeBuilder(&local_48,2);
  ::wasm::Type::Type(&local_60,none);
  local_78 = local_18.id;
  ::wasm::Signature::Signature(&local_58,local_60,local_18);
  local_88 = ::wasm::TypeBuilder::operator[](&local_48,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_88,local_58);
  local_a0.id = local_18.id;
  ::wasm::Type::Type(&local_a8,none);
  ::wasm::Signature::Signature(&local_98,local_a0,local_a8);
  local_b8 = ::wasm::TypeBuilder::operator[](&local_48,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_b8,local_98);
  local_c8 = ::wasm::TypeBuilder::operator[](&local_48,1);
  EVar3 = ::wasm::TypeBuilder::operator[](&local_48,0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar3.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_d8,(Entry *)&gtest_ar_.message_);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d8._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_c8,other);
  ::wasm::TypeBuilder::build();
  bVar1 = ::wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_120);
  local_f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  ::wasm::TypeBuilder::BuildResult::~BuildResult(&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder_1,(internal *)local_f8,(AssertionResult *)"builder.build()","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&builder_1);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  ::wasm::TypeBuilder::~TypeBuilder(&local_48);
  ::wasm::TypeBuilder::TypeBuilder(&local_158,2);
  ::wasm::Type::Type(&local_170,none);
  local_198 = local_18.id;
  local_190 = local_18.id;
  local_188 = &local_198;
  local_180 = 2;
  ::wasm::Type::Type(&local_178,local_188,2);
  ::wasm::Signature::Signature(&local_168,local_170,local_178);
  local_1a8 = ::wasm::TypeBuilder::operator[](&local_158,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_1a8,local_168);
  ::wasm::Type::Type(&local_1c0,none);
  local_1f0 = local_18.id;
  local_1e8 = local_18.id;
  local_1e0 = local_18.id;
  local_1d8 = &local_1f0;
  local_1d0 = 3;
  ::wasm::Type::Type(&local_1c8,local_1d8,3);
  ::wasm::Signature::Signature(&local_1b8,local_1c0,local_1c8);
  local_200 = ::wasm::TypeBuilder::operator[](&local_158,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_200,local_1b8);
  local_210 = ::wasm::TypeBuilder::operator[](&local_158,1);
  EVar3 = ::wasm::TypeBuilder::operator[](&local_158,0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar3.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_220,(Entry *)&gtest_ar__1.message_);
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_220._0_8_;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_220[8];
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_220._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_210,other_00);
  ::wasm::TypeBuilder::build();
  bVar1 = ::wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_268);
  local_241 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  ::wasm::TypeBuilder::BuildResult::~BuildResult(&local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder_2,(internal *)local_240,(AssertionResult *)"builder.build()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5a9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&builder_2);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  ::wasm::TypeBuilder::~TypeBuilder(&local_158);
  ::wasm::TypeBuilder::TypeBuilder(&local_2a0,2);
  local_2c8 = local_18.id;
  ::wasm::Field::Field(&local_2c0,local_18,Mutable);
  ::wasm::Array::Array(&local_2b0,local_2c0);
  local_2d8 = ::wasm::TypeBuilder::operator[](&local_2a0,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_2d8,&local_2b0);
  local_300 = local_28.id;
  ::wasm::Field::Field(&local_2f8,local_28,Mutable);
  ::wasm::Array::Array(&local_2e8,local_2f8);
  local_310 = ::wasm::TypeBuilder::operator[](&local_2a0,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_310,&local_2e8);
  local_320 = ::wasm::TypeBuilder::operator[](&local_2a0,1);
  EVar3 = ::wasm::TypeBuilder::operator[](&local_2a0,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar3.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_330,(Entry *)&gtest_ar__2.message_);
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_330._0_8_;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_330[8];
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_330._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_320,other_01);
  ::wasm::TypeBuilder::build();
  bVar1 = ::wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_378);
  local_351 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_350,&local_351,(type *)0x0);
  ::wasm::TypeBuilder::BuildResult::~BuildResult(&local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder_3,(internal *)local_350,(AssertionResult *)"builder.build()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5b2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&builder_3);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  ::wasm::TypeBuilder::~TypeBuilder(&local_2a0);
  ::wasm::TypeBuilder::TypeBuilder(&local_3b0,2);
  local_418 = local_18.id;
  ::wasm::Field::Field(&local_410,local_18,Immutable);
  local_420 = local_18.id;
  ::wasm::Field::Field(&local_400,local_18,Immutable);
  local_3f0 = &local_410;
  local_3e8 = 2;
  std::allocator<wasm::Field>::allocator(&local_421);
  __l_00._M_len = local_3e8;
  __l_00._M_array = local_3f0;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_3e0,__l_00,&local_421);
  ::wasm::Struct::Struct(&local_3c8,&local_3e0);
  local_438 = ::wasm::TypeBuilder::operator[](&local_3b0,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_438,&local_3c8);
  ::wasm::Struct::~Struct(&local_3c8);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_3e0);
  std::allocator<wasm::Field>::~allocator(&local_421);
  local_4a0 = local_38.id;
  ::wasm::Field::Field(&local_498,local_38,Immutable);
  local_4a8 = local_18.id;
  ::wasm::Field::Field(&local_488,local_18,Immutable);
  local_478 = &local_498;
  local_470 = 2;
  std::allocator<wasm::Field>::allocator(&local_4a9);
  __l._M_len = local_470;
  __l._M_array = local_478;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_468,__l,&local_4a9);
  ::wasm::Struct::Struct(&local_450,&local_468);
  local_4c0 = ::wasm::TypeBuilder::operator[](&local_3b0,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_4c0,&local_450);
  ::wasm::Struct::~Struct(&local_450);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_468);
  std::allocator<wasm::Field>::~allocator(&local_4a9);
  local_4d0 = ::wasm::TypeBuilder::operator[](&local_3b0,1);
  EVar3 = ::wasm::TypeBuilder::operator[](&local_3b0,0);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar3.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_4e0,(Entry *)&gtest_ar__3.message_);
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_4e0._0_8_;
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_4e0[8];
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_4e0._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_4d0,other_02);
  ::wasm::TypeBuilder::build();
  bVar1 = ::wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_528);
  local_501 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  ::wasm::TypeBuilder::BuildResult::~BuildResult(&local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_558,(internal *)local_500,(AssertionResult *)"builder.build()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5bb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  ::wasm::TypeBuilder::~TypeBuilder(&local_3b0);
  return;
}

Assistant:

TEST_F(TypeTest, TestSubtypeErrors) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type funcref = Type(HeapType::func, Nullable);

  {
    // Incompatible signatures.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, anyref);
    builder[1] = Signature(anyref, Type::none);
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Signatures incompatible in tuple size.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, {anyref, anyref});
    builder[1] = Signature(Type::none, {anyref, anyref, anyref});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Mutable array fields are invariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Mutable));
    builder[1] = Array(Field(eqref, Mutable));
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Incompatible struct prefixes
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1] = Struct({Field(funcref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }
}